

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix_with_column_compression.h
# Opt level: O3

void Gudhi::persistence_matrix::swap
               (Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                *matrix1,
               Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
               *matrix2)

{
  Index IVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer ppCVar8;
  Column_settings *pCVar9;
  Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>
  *pSVar10;
  pointer puVar11;
  pointer puVar12;
  pointer ppCVar13;
  pointer ppCVar14;
  pointer ppCVar15;
  pointer puVar16;
  pointer puVar17;
  
  boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::
  swap_tree((node_ptr)matrix1,(node_ptr)matrix2);
  puVar2 = (matrix1->columnClasses_).rank.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar11 = (matrix1->columnClasses_).rank.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar12 = (matrix1->columnClasses_).rank.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (matrix1->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (matrix1->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (matrix1->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar16 = (matrix1->columnClasses_).parent.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (matrix1->columnClasses_).parent.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar3 = (matrix1->columnClasses_).parent.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (matrix1->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (matrix1->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (matrix1->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(matrix1->columnClasses_).rank,&(matrix2->columnClasses_).rank);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(matrix1->columnClasses_).parent,&(matrix2->columnClasses_).parent);
  puVar4 = (matrix2->columnClasses_).rank.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (matrix2->columnClasses_).rank.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (matrix2->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar11;
  (matrix2->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar12;
  (matrix2->columnClasses_).rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
  }
  puVar6 = (matrix2->columnClasses_).parent.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (matrix2->columnClasses_).parent.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (matrix2->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar16;
  (matrix2->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar17;
  (matrix2->columnClasses_).parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar7 - (long)puVar6);
  }
  ppCVar8 = (matrix1->repToColumn_).
            super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppCVar13 = (matrix2->repToColumn_).
             super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar14 = (matrix1->repToColumn_).
             super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar15 = (matrix1->repToColumn_).
             super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (matrix2->repToColumn_).
       super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppCVar13;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (matrix2->repToColumn_).
       super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppCVar14;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppCVar15;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar8;
  IVar1 = matrix1->nextColumnIndex_;
  matrix1->nextColumnIndex_ = matrix2->nextColumnIndex_;
  matrix2->nextColumnIndex_ = IVar1;
  pCVar9 = matrix1->colSettings_;
  matrix1->colSettings_ = matrix2->colSettings_;
  matrix2->colSettings_ = pCVar9;
  pSVar10 = (matrix1->columnPool_)._M_t.
            super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
            .
            super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
            ._M_head_impl;
  (matrix1->columnPool_)._M_t.
  super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  .
  super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
  ._M_head_impl =
       (matrix2->columnPool_)._M_t.
       super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
       .
       super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
       ._M_head_impl;
  (matrix2->columnPool_)._M_t.
  super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  .
  super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
  ._M_head_impl = pSVar10;
  return;
}

Assistant:

void swap(Base_matrix_with_column_compression& matrix1, Base_matrix_with_column_compression& matrix2) {
    matrix1.columnToRep_.swap(matrix2.columnToRep_);
    std::swap(matrix1.columnClasses_, matrix2.columnClasses_);
    matrix1.repToColumn_.swap(matrix2.repToColumn_);
    std::swap(matrix1.nextColumnIndex_, matrix2.nextColumnIndex_);
    std::swap(matrix1.colSettings_, matrix2.colSettings_);
    std::swap(matrix1.columnPool_, matrix2.columnPool_);

    if constexpr (Master_matrix::Option_list::has_row_access) {
      swap(static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix1),
           static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix2));
    }
  }